

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::resolveLocale(QWidgetPrivate *this)

{
  bool bVar1;
  QWidget *this_00;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *parent;
  QWidget *q;
  QWidget *in_stack_ffffffffffffffd8;
  QWidgetPrivate *pQVar2;
  undefined1 forceUpdate;
  QLocale in_stack_fffffffffffffff0;
  QWidgetPrivate *this_01;
  
  this_01 = *(QWidgetPrivate **)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  q_func(in_RDI);
  forceUpdate = (undefined1)((ulong)pQVar2 >> 0x38);
  bVar1 = QWidget::testAttribute(in_stack_ffffffffffffffd8,(WidgetAttribute)((ulong)in_RDI >> 0x20))
  ;
  if (!bVar1) {
    this_00 = QWidget::parentWidget((QWidget *)0x37135c);
    if ((this_00 == (QWidget *)0x0) ||
       ((bVar1 = QWidget::isWindow((QWidget *)in_RDI), bVar1 &&
        (bVar1 = QWidget::testAttribute(this_00,(WidgetAttribute)((ulong)in_RDI >> 0x20)), !bVar1)))
       ) {
      QLocale::QLocale((QLocale *)&stack0xfffffffffffffff0);
    }
    else {
      QWidget::locale(this_00);
    }
    setLocale_helper(this_01,(QLocale *)in_stack_fffffffffffffff0,(bool)forceUpdate);
    QLocale::~QLocale((QLocale *)&stack0xfffffffffffffff0);
  }
  if (*(QWidgetPrivate **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::resolveLocale()
{
    Q_Q(const QWidget);

    if (!q->testAttribute(Qt::WA_SetLocale)) {
        QWidget *parent = q->parentWidget();
        setLocale_helper(!parent || (q->isWindow() && !q->testAttribute(Qt::WA_WindowPropagation))
                         ? QLocale() : parent->locale());
    }
}